

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O2

double xc_bessel_K1_scaled(double x)

{
  int N;
  double *cs;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (x <= 0.0) {
    fwrite("Domain error in bessel_K1_scaled\n",0x21,1,_stderr);
    dVar1 = 0.0;
  }
  else if (x <= 2.0) {
    dVar1 = exp(x);
    dVar4 = log(x * 0.5);
    dVar2 = xc_bessel_I1(x);
    dVar3 = xc_cheb_eval(x * 0.5 * x + -1.0,bk1_data,0xb);
    dVar1 = (dVar2 * dVar4 + (dVar3 + 0.75) / x) * dVar1;
  }
  else {
    if (x <= 8.0) {
      dVar1 = (16.0 / x + -5.0) / 3.0;
      cs = ak1_data;
      N = 0x11;
    }
    else {
      dVar1 = 16.0 / x + -1.0;
      cs = ak12_data;
      N = 0xe;
    }
    dVar4 = xc_cheb_eval(dVar1,cs,N);
    if (x < 0.0) {
      dVar1 = sqrt(x);
    }
    else {
      dVar1 = SQRT(x);
    }
    dVar1 = (dVar4 + 1.25) / dVar1;
  }
  return dVar1;
}

Assistant:

GPU_FUNCTION
double xc_bessel_K1_scaled(const double x)
{
  double r = 0.0;

  if(x <= 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Domain error in bessel_K1_scaled\n");
#endif
  } else if(x <= 2.0)
    r =  exp(x)*(log(0.5*x)*xc_bessel_I1(x) +
		 (0.75 + xc_cheb_eval(.5*x*x - 1.0, bk1_data, 11))/x);
  else if(x <= 8.0)
    r = (1.25 + xc_cheb_eval((16.0/x - 5.0)/3.0, ak1_data, 17))/sqrt(x);
  else
    r = (1.25 + xc_cheb_eval(16.0/x - 1.0, ak12_data, 14))/sqrt(x);

  return r;
}